

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void trompeloeil::reporter<trompeloeil::specialized>::sendOk
               (char *trompeloeil_mock_calls_done_correctly)

{
  long in_RDI;
  StringRef macroName;
  StringRef capturedExpression;
  AssertionHandler catchAssertionHandler;
  long local_98;
  ITransientExpression local_90;
  long *local_80;
  char *local_78;
  undefined8 local_70;
  undefined4 local_68;
  AssertionHandler local_60;
  
  local_90._vptr_ITransientExpression = (_func_int **)0x446af2;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x2a;
  capturedExpression.m_start = "trompeloeil_mock_calls_done_correctly != 0";
  local_98 = in_RDI;
  Catch::AssertionHandler::AssertionHandler
            (&local_60,macroName,(SourceLineInfo *)&local_90,capturedExpression,Normal);
  local_90.m_result = local_98 != 0;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_004f5148;
  local_78 = "!=";
  local_70 = 2;
  local_68 = 0;
  local_80 = &local_98;
  Catch::AssertionHandler::handleExpr(&local_60,&local_90);
  Catch::ITransientExpression::~ITransientExpression(&local_90);
  Catch::AssertionHandler::complete(&local_60);
  if (local_60.m_completed == false) {
    (*(local_60.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

inline void reporter<specialized>::sendOk(
    const char* trompeloeil_mock_calls_done_correctly)
  {      
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
#else
      REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
#endif
  }